

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXException.hpp
# Opt level: O1

void __thiscall
xercesc_4_0::SAXNotSupportedException::~SAXNotSupportedException(SAXNotSupportedException *this)

{
  XMLCh *p;
  
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXException_00418450;
  p = (this->super_SAXException).fMsg;
  (*((this->super_SAXException).fMemoryManager)->_vptr_MemoryManager[4])();
  XMemory::operator_delete((XMemory *)this,p);
  return;
}

Assistant:

class SAX_EXPORT SAXNotSupportedException : public SAXException
{

public:
	SAXNotSupportedException(MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager);

  /**
    * Create a new SAXException.
    *
    * @param msg The error or warning message.
    * @param manager    Pointer to the memory manager to be used to
    *                   allocate objects.
    */
    SAXNotSupportedException(const XMLCh* const msg,
                             MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager);

  /**
    * Create a new SAXException.
    *
    * @param msg The error or warning message.
    * @param manager    Pointer to the memory manager to be used to
    *                   allocate objects.
    */
    SAXNotSupportedException(const char* const msg,
                             MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager);

  /**
    * Copy constructor
    *
    * @param toCopy The exception to be copy constructed
    */
    SAXNotSupportedException(const SAXException& toCopy);
}